

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9MemObjToString(jx9_value *pObj)

{
  uint uVar1;
  
  if ((pObj->iFlags & 1) == 0) {
    (pObj->sBlob).nByte = 0;
    uVar1 = (pObj->sBlob).nFlags;
    if ((uVar1 & 4) != 0) {
      (pObj->sBlob).pBlob = (void *)0x0;
      (pObj->sBlob).mByte = 0;
      (pObj->sBlob).nFlags = uVar1 & 0xfffffffb;
    }
    MemObjStringValue(&pObj->sBlob,pObj);
    pObj->iFlags = (pObj->iFlags & 0xfffffe90U) + 1;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToString(jx9_value *pObj)
{
	sxi32 rc = SXRET_OK;
	if( (pObj->iFlags & MEMOBJ_STRING) == 0 ){
		/* Perform the conversion */
		SyBlobReset(&pObj->sBlob); /* Reset the internal buffer */
		rc = MemObjStringValue(&pObj->sBlob, &(*pObj));
		MemObjSetType(pObj, MEMOBJ_STRING);
	}
	return rc;
}